

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::SlackColSubstitution::undo
          (SlackColSubstitution *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *rowValues,HighsSolution *solution,HighsBasis *basis)

{
  int iVar1;
  bool bVar2;
  HighsBasisStatus HVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  byte *in_R8;
  double dVar10;
  HighsBasisStatus save_row_basis_status;
  Nonzero *rowVal;
  const_iterator __end1;
  const_iterator __begin1;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *__range1;
  HighsCDouble rowValue;
  double colCoef;
  bool isModelRow;
  bool debug_print;
  HighsCDouble *in_stack_fffffffffffffe98;
  HighsCDouble *in_stack_fffffffffffffea0;
  HighsCDouble *in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb1;
  undefined1 in_stack_fffffffffffffeb2;
  undefined1 in_stack_fffffffffffffeb3;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  value_type vVar11;
  undefined1 in_stack_fffffffffffffeb7;
  string local_110 [15];
  HighsBasisStatus in_stack_fffffffffffffeff;
  string local_e0 [32];
  string local_c0 [39];
  value_type local_99;
  HighsCDouble local_98;
  HighsCDouble local_88;
  HighsCDouble local_78;
  reference local_68;
  Nonzero *local_60;
  __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
  local_58;
  undefined8 local_50;
  HighsCDouble local_48;
  double local_38;
  byte local_2a;
  byte local_29;
  byte *local_28;
  long local_20;
  undefined8 local_18;
  
  local_29 = 0;
  iVar1 = *(int *)(in_RDI + 8);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x38));
  local_2a = (ulong)(long)iVar1 < sVar4;
  local_38 = 0.0;
  HighsCDouble::HighsCDouble(&local_48,0.0);
  local_50 = local_18;
  local_58._M_current =
       (Nonzero *)
       std::
       vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
       ::begin((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_fffffffffffffe98);
  local_60 = (Nonzero *)
             std::
             vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ::end((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                    *)in_stack_fffffffffffffe98);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
                             *)in_stack_fffffffffffffe98), bVar2) {
    local_68 = __gnu_cxx::
               __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
               ::operator*(&local_58);
    if (local_68->index == *(int *)(in_RDI + 0xc)) {
      local_38 = local_68->value;
    }
    else {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_20 + 8),(long)local_68->index);
      HighsCDouble::operator+=
                ((HighsCDouble *)
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,
                                   CONCAT15(in_stack_fffffffffffffeb5,
                                            CONCAT14(in_stack_fffffffffffffeb4,
                                                     CONCAT13(in_stack_fffffffffffffeb3,
                                                              CONCAT12(in_stack_fffffffffffffeb2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffeb1,
                                                  in_stack_fffffffffffffeb0))))))),
                 (double)in_stack_fffffffffffffea8);
    }
    __gnu_cxx::
    __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
    ::operator++(&local_58);
  }
  if ((local_2a & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_20 + 8),
               (long)*(int *)(in_RDI + 0xc));
    local_78 = HighsCDouble::operator+(in_stack_fffffffffffffea0,(double)in_stack_fffffffffffffe98);
    dVar10 = HighsCDouble::operator_cast_to_double(&local_78);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),
                        (long)*(int *)(in_RDI + 8));
    *pvVar5 = dVar10;
  }
  local_98 = ::operator-((double)CONCAT17(in_stack_fffffffffffffeb7,
                                          CONCAT16(in_stack_fffffffffffffeb6,
                                                   CONCAT15(in_stack_fffffffffffffeb5,
                                                            CONCAT14(in_stack_fffffffffffffeb4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffeb3,
                                                  CONCAT12(in_stack_fffffffffffffeb2,
                                                           CONCAT11(in_stack_fffffffffffffeb1,
                                                                    in_stack_fffffffffffffeb0)))))))
                         ,in_stack_fffffffffffffea8);
  local_88 = HighsCDouble::operator/(in_stack_fffffffffffffe98,3.50142001099156e-317);
  dVar10 = HighsCDouble::operator_cast_to_double(&local_88);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(local_20 + 8),
                      (long)*(int *)(in_RDI + 0xc));
  *pvVar5 = dVar10;
  if ((*(byte *)(local_20 + 1) & 1) != 0) {
    if ((local_2a & 1) != 0) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),
                          (long)*(int *)(in_RDI + 8));
      dVar10 = -*pvVar5 / local_38;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                          (long)*(int *)(in_RDI + 0xc));
      *pvVar5 = dVar10;
    }
    if ((*local_28 & 1) != 0) {
      if ((local_2a & 1) == 0) {
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
        *pvVar6 = kNonbasic;
      }
      else {
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_28 + 0x48),(long)*(int *)(in_RDI + 8));
        local_99 = *pvVar6;
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_28 + 0x48),(long)*(int *)(in_RDI + 8));
        if (*pvVar6 == kBasic) {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
          *pvVar6 = kBasic;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),
                              (long)*(int *)(in_RDI + 8));
          HVar3 = computeRowStatus(*pvVar5,kEq);
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_28 + 0x48),(long)*(int *)(in_RDI + 8));
          *pvVar6 = HVar3;
        }
        else {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_28 + 0x48),(long)*(int *)(in_RDI + 8));
          if (*pvVar6 == kLower) {
            vVar11 = kUpper;
            if (local_38 <= 0.0) {
              vVar11 = kLower;
            }
            pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
            *pvVar6 = vVar11;
          }
          else {
            vVar11 = kLower;
            if (local_38 <= 0.0) {
              vVar11 = kUpper;
            }
            pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
            *pvVar6 = vVar11;
          }
        }
        if ((local_29 & 1) != 0) {
          utilBasisStatusToString_abi_cxx11_(in_stack_fffffffffffffeff);
          uVar7 = std::__cxx11::string::c_str();
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                     (local_28 + 0x48),(long)*(int *)(in_RDI + 8));
          utilBasisStatusToString_abi_cxx11_(in_stack_fffffffffffffeff);
          uVar8 = std::__cxx11::string::c_str();
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                     (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
          utilBasisStatusToString_abi_cxx11_(in_stack_fffffffffffffeff);
          uVar9 = std::__cxx11::string::c_str();
          printf("HighsPostsolveStack::SlackColSubstitution::undo OgRowStatus = %s; RowStatus = %s; ColStatus = %s\n"
                 ,uVar7,uVar8,uVar9);
          std::__cxx11::string::~string(local_110);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_c0);
        }
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
        if (*pvVar6 != kLower) {
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                     (local_28 + 0x30),(long)*(int *)(in_RDI + 0xc));
        }
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::SlackColSubstitution::undo(
    const HighsOptions& options, const std::vector<Nonzero>& rowValues,
    HighsSolution& solution, HighsBasis& basis) {
  bool debug_print = false;
  // May have to determine row dual and basis status unless doing
  // primal-only transformation in MIP solver, in which case row may
  // no longer exist if it corresponds to a removed cut, so have to
  // avoid exceeding array bounds of solution.row_value
  bool isModelRow = static_cast<size_t>(row) < solution.row_value.size();

  // compute primal values
  double colCoef = 0;
  HighsCDouble rowValue = 0;
  for (const auto& rowVal : rowValues) {
    if (rowVal.index == col)
      colCoef = rowVal.value;
    else
      rowValue += rowVal.value * solution.col_value[rowVal.index];
  }

  assert(colCoef != 0);
  // Row values aren't fully postsolved, so why do this?
  if (isModelRow)
    solution.row_value[row] =
        double(rowValue + colCoef * solution.col_value[col]);

  solution.col_value[col] = double((rhs - rowValue) / colCoef);

  // If no dual values requested, return here
  if (!solution.dual_valid) return;

  // Row retains its dual value, and column has this dual value scaled by coeff
  if (isModelRow) solution.col_dual[col] = -solution.row_dual[row] / colCoef;

  // Set basis status if necessary
  if (!basis.valid) return;

  // If row is basic, then slack is basic, otherwise row retains its status
  if (isModelRow) {
    HighsBasisStatus save_row_basis_status = basis.row_status[row];
    if (basis.row_status[row] == HighsBasisStatus::kBasic) {
      basis.col_status[col] = HighsBasisStatus::kBasic;
      basis.row_status[row] =
          computeRowStatus(solution.row_dual[row], RowType::kEq);
    } else if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kUpper : HighsBasisStatus::kLower;
    } else {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
    }
    if (debug_print)
      printf(
          "HighsPostsolveStack::SlackColSubstitution::undo OgRowStatus = %s; "
          "RowStatus = %s; ColStatus = %s\n",
          utilBasisStatusToString(save_row_basis_status).c_str(),
          utilBasisStatusToString(basis.row_status[row]).c_str(),
          utilBasisStatusToString(basis.col_status[col]).c_str());
    if (basis.col_status[col] == HighsBasisStatus::kLower) {
      assert(solution.col_dual[col] > -options.dual_feasibility_tolerance);
    } else if (basis.col_status[col] == HighsBasisStatus::kUpper) {
      assert(solution.col_dual[col] < options.dual_feasibility_tolerance);
    }
  } else {
    basis.col_status[col] = HighsBasisStatus::kNonbasic;
  }
}